

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int net_tcp_accept(NETSOCKET sock,NETSOCKET *new_sock,NETADDR *a)

{
  int iVar1;
  long in_FS_OFFSET;
  socklen_t sockaddr_len;
  sockaddr_in addr;
  socklen_t local_48;
  sockaddr local_44;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  new_sock->type = 0;
  new_sock->ipv4sock = -1;
  new_sock->ipv6sock = -1;
  if (-1 < sock._0_8_) {
    local_48 = 0x10;
    iVar1 = accept(sock.ipv4sock,&local_44,&local_48);
    if (iVar1 != -1) {
      sockaddr_to_netaddr((sockaddr *)&local_44,a);
      new_sock->type = 1;
      new_sock->ipv4sock = iVar1;
      goto LAB_00143ea1;
    }
  }
  if (-1 < sock.ipv6sock) {
    local_48 = 0x1c;
    iVar1 = accept(sock.ipv6sock,&local_44,&local_48);
    if (iVar1 != -1) {
      sockaddr_to_netaddr((sockaddr *)&local_44,a);
      new_sock->type = 2;
      new_sock->ipv6sock = iVar1;
      goto LAB_00143ea1;
    }
  }
  iVar1 = -1;
LAB_00143ea1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int net_tcp_accept(NETSOCKET sock, NETSOCKET *new_sock, NETADDR *a)
{
	int s;
	socklen_t sockaddr_len;

	*new_sock = invalid_socket;

	if(sock.ipv4sock >= 0)
	{
		struct sockaddr_in addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv4sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV4;
			new_sock->ipv4sock = s;
			return s;
		}
	}

	if(sock.ipv6sock >= 0)
	{
		struct sockaddr_in6 addr;
		sockaddr_len = sizeof(addr);

		s = accept(sock.ipv6sock, (struct sockaddr *)&addr, &sockaddr_len);

		if (s != -1)
		{
			sockaddr_to_netaddr((const struct sockaddr *)&addr, a);
			new_sock->type = NETTYPE_IPV6;
			new_sock->ipv6sock = s;
			return s;
		}
	}

	return -1;
}